

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O0

void __thiscall
fmcalc::dofmcalc_stepped(fmcalc *this,vector<LossRec,_std::allocator<LossRec>_> *agg_vec,int layer)

{
  bool bVar1;
  reference pvVar2;
  __normal_iterator<const_profile_rec_new_*,_std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>
  local_68;
  profile_rec_new *local_60;
  reference local_58;
  profile_rec_new *profile;
  __normal_iterator<const_profile_rec_new_*,_std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>
  local_48;
  const_iterator iter;
  LossRec *x;
  iterator __end1;
  iterator __begin1;
  vector<LossRec,_std::allocator<LossRec>_> *__range1;
  int layer_local;
  vector<LossRec,_std::allocator<LossRec>_> *agg_vec_local;
  fmcalc *this_local;
  
  __end1 = std::vector<LossRec,_std::allocator<LossRec>_>::begin(agg_vec);
  x = (LossRec *)std::vector<LossRec,_std::allocator<LossRec>_>::end(agg_vec);
  while ((bVar1 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                                      *)&x), bVar1 &&
         (iter._M_current =
               (profile_rec_new *)
               __gnu_cxx::
               __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
               operator*(&__end1), ((reference)iter._M_current)->agg_id != 0))) {
    if ((0 < ((reference)iter._M_current)->agg_id) &&
       (((0.0 < ((reference)iter._M_current)->loss ||
         (0.0 < ((reference)iter._M_current)->retained_loss)) &&
        (0 < ((reference)iter._M_current)->policytc_id)))) {
      pvVar2 = std::
               vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
               ::operator[](&this->profile_vec_stepped_,
                            (long)((reference)iter._M_current)->policytc_id);
      local_48._M_current =
           (profile_rec_new *)
           std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::cbegin(pvVar2);
      while( true ) {
        pvVar2 = std::
                 vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
                 ::operator[](&this->profile_vec_stepped_,
                              (long)*(int *)((long)&iter._M_current[1].tc_vec.
                                                                                                        
                                                  super__Vector_base<tc_rec,_std::allocator<tc_rec>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
        profile = (profile_rec_new *)
                  std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::cend(pvVar2);
        bVar1 = __gnu_cxx::operator!=
                          (&local_48,
                           (__normal_iterator<const_profile_rec_new_*,_std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>
                            *)&profile);
        if (!bVar1) break;
        local_58 = __gnu_cxx::
                   __normal_iterator<const_profile_rec_new_*,_std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>
                   ::operator*(&local_48);
        local_60 = (profile_rec_new *)
                   __gnu_cxx::
                   __normal_iterator<const_profile_rec_new_*,_std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>
                   ::operator++(&local_48,0);
        pvVar2 = std::
                 vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
                 ::operator[](&this->profile_vec_stepped_,
                              (long)*(int *)((long)&iter._M_current[1].tc_vec.
                                                                                                        
                                                  super__Vector_base<tc_rec,_std::allocator<tc_rec>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
        local_68._M_current =
             (profile_rec_new *)
             std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::cend(pvVar2);
        bVar1 = __gnu_cxx::operator==(&local_48,&local_68);
        if (bVar1) {
          if (local_58->calcrule_id != 100) {
            applycalcrule_stepped(local_58,(LossRec *)iter._M_current,layer,true);
          }
        }
        else if (local_58->calcrule_id != 100) {
          applycalcrule_stepped(local_58,(LossRec *)iter._M_current,layer,false);
        }
      }
    }
    __gnu_cxx::__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void fmcalc::dofmcalc_stepped(std::vector <LossRec>& agg_vec, int layer)
{
	for (LossRec& x : agg_vec) {
		if (x.agg_id == 0) break;
		if (x.agg_id > 0) {
			if (x.loss > 0 || x.retained_loss > 0) {
				if (x.policytc_id > 0) {
					auto iter = profile_vec_stepped_[x.policytc_id].cbegin();
					while (iter != profile_vec_stepped_[x.policytc_id].cend()) {
						const profile_rec_new& profile = *(iter);						
						iter++;
						if (iter == profile_vec_stepped_[x.policytc_id].cend()) {
							if (profile.calcrule_id != 100) applycalcrule_stepped(profile, x, layer,true);
						}
						else {
							if (profile.calcrule_id != 100) applycalcrule_stepped(profile, x, layer, false);
						}
					}
				}
			}
		}
	}
}